

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O3

void __thiscall indigox::Atom::Clear(Atom *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  std::__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->mol_).super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>);
  this_00 = (this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>::
  _M_erase_at_end(&this->bonds_,
                  (this->bonds_).
                  super__Vector_base<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  (this->pos_)._M_elems[2] = 0.0;
  (this->pos_)._M_elems[0] = 0.0;
  (this->pos_)._M_elems[1] = 0.0;
  return;
}

Assistant:

void Atom::Clear() {
    mol_.reset();
    element_.reset();
    bonds_.clear();
    pos_.fill(0.0);
  }